

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

void * __thiscall lan::db::operator[](db *this,string *context)

{
  void *pvVar1;
  db_bits *pdVar2;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)context);
  pdVar2 = find_rec(this,&local_30,Container,this->first);
  pvVar1 = pdVar2->data;
  std::__cxx11::string::~string((string *)&local_30);
  return pvVar1;
}

Assistant:

void * db::operator[](std::string const context){
            return find_rec(context, lan::Container, first)->data;
        }